

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTestSchema(Parse *pParse,char *zDb,int bTemp)

{
  sqlite3NestedParse(pParse,
                     "SELECT 1 FROM \"%w\".%s WHERE name NOT LIKE \'sqlite_%%\' AND sql NOT LIKE \'create virtual%%\' AND sqlite_rename_test(%Q, sql, type, name, %d)=NULL "
                     ,zDb,"sqlite_master",zDb,(ulong)(uint)bTemp);
  if (bTemp != 0) {
    return;
  }
  sqlite3NestedParse(pParse,
                     "SELECT 1 FROM temp.%s WHERE name NOT LIKE \'sqlite_%%\' AND sql NOT LIKE \'create virtual%%\' AND sqlite_rename_test(%Q, sql, type, name, 1)=NULL "
                     ,"sqlite_master",zDb);
  return;
}

Assistant:

static void renameTestSchema(Parse *pParse, const char *zDb, int bTemp){
  sqlite3NestedParse(pParse, 
      "SELECT 1 "
      "FROM \"%w\".%s "
      "WHERE name NOT LIKE 'sqlite_%%'"
      " AND sql NOT LIKE 'create virtual%%'"
      " AND sqlite_rename_test(%Q, sql, type, name, %d)=NULL ",
      zDb, MASTER_NAME, 
      zDb, bTemp
  );

  if( bTemp==0 ){
    sqlite3NestedParse(pParse, 
        "SELECT 1 "
        "FROM temp.%s "
        "WHERE name NOT LIKE 'sqlite_%%'"
        " AND sql NOT LIKE 'create virtual%%'"
        " AND sqlite_rename_test(%Q, sql, type, name, 1)=NULL ",
        MASTER_NAME, zDb 
    );
  }
}